

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

R_conflict7
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_int>_>::allocateSpans(size_t numBuckets)

{
  undefined4 *puVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  R_conflict7 RVar5;
  
  if (numBuckets < 0x71c71c71c71c7181) {
    uVar3 = numBuckets >> 7;
    puVar2 = (ulong *)operator_new__(uVar3 * 0x90 + 8);
    *puVar2 = uVar3;
    if (0x7f < numBuckets) {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)puVar2 + lVar4 + 0x88) = 0;
        *(undefined2 *)((long)puVar2 + lVar4 + 0x90) = 0;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 8);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x18);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x28);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x38);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x48);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x58);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x68);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        puVar1 = (undefined4 *)((long)puVar2 + lVar4 + 0x78);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        lVar4 = lVar4 + 0x90;
      } while (uVar3 * 0x90 != lVar4);
    }
    RVar5.nSpans = uVar3;
    RVar5.spans = (Span *)(puVar2 + 1);
    return RVar5;
  }
  qBadAlloc();
}

Assistant:

static auto allocateSpans(size_t numBuckets)
    {
        struct R {
            Span *spans;
            size_t nSpans;
        };

        constexpr qptrdiff MaxSpanCount = (std::numeric_limits<qptrdiff>::max)() / sizeof(Span);
        constexpr size_t MaxBucketCount = MaxSpanCount << SpanConstants::SpanShift;

        if (numBuckets > MaxBucketCount) {
            Q_CHECK_PTR(false);
            Q_UNREACHABLE();    // no exceptions and no assertions -> no error reporting
        }

        size_t nSpans = numBuckets >> SpanConstants::SpanShift;
        return R{ new Span[nSpans], nSpans };
    }